

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmsg.c
# Opt level: O1

int main(int argc,char **argv)

{
  uint uVar1;
  int line;
  int iVar2;
  int iVar3;
  long *plVar4;
  long *extraout_RAX;
  long *extraout_RAX_00;
  int sock;
  int sock_00;
  int sock_01;
  int sock_02;
  int sock_03;
  int sock_04;
  char *pcVar5;
  uchar body [3];
  nn_msghdr hdr;
  nn_iovec iovec;
  void *buf;
  char socket_address [128];
  uchar ctrl [256];
  undefined1 local_1e3 [3];
  undefined1 **local_1e0;
  undefined4 local_1d8;
  undefined1 *local_1d0;
  undefined8 local_1c8;
  undefined1 *local_1c0;
  undefined8 local_1b8;
  undefined1 local_1b0 [8];
  char local_1a8 [128];
  undefined1 local_128 [256];
  
  if (argc < 2) {
    pcVar5 = "5555";
  }
  else {
    pcVar5 = argv[1];
  }
  uVar1 = atoi(pcVar5);
  pcVar5 = "127.0.0.1";
  sprintf(local_1a8,"%s://%s:%d","tcp","127.0.0.1",(ulong)uVar1);
  line = test_socket_impl((char *)0x30,2,0x31,(int)pcVar5);
  iVar2 = nn_bind(line,local_1a8);
  if (-1 < iVar2) {
    iVar2 = test_socket_impl((char *)0x32,1,0x30,(int)pcVar5);
    iVar3 = nn_connect(iVar2,local_1a8);
    if (iVar3 < 0) goto LAB_00101a96;
    test_send_impl((char *)0x37,iVar2,sock,pcVar5);
    local_1b8 = 3;
    local_1d8 = 1;
    local_1d0 = local_128;
    local_1c8 = 0x100;
    local_1e0 = &local_1c0;
    local_1c0 = local_1e3;
    iVar3 = nn_recvmsg(line,&local_1e0,0);
    if (iVar3 == 3) {
      plVar4 = (long *)nn_cmsg_nxthdr_(&local_1e0,0);
      if (plVar4 != (long *)0x0) {
        do {
          if (((int)plVar4[1] == 1) && (*(int *)((long)plVar4 + 0xc) == 1)) goto LAB_0010193b;
          plVar4 = (long *)nn_cmsg_nxthdr_(&local_1e0,plVar4);
        } while (plVar4 != (long *)0x0);
      }
      main_cold_12();
      plVar4 = extraout_RAX;
LAB_0010193b:
      if (*plVar4 != 0x20) goto LAB_00101a5f;
      if ((char)plVar4[3] < '\0') goto LAB_00101a64;
      if (-1 < *(char *)((long)plVar4 + 0x1c)) goto LAB_00101a69;
      iVar3 = nn_sendmsg(line,&local_1e0,0);
      if (iVar3 != 3) goto LAB_00101a6e;
      test_recv_impl((char *)0x50,iVar2,sock_00,pcVar5);
      test_send_impl((char *)0x54,iVar2,sock_01,pcVar5);
      local_1b8 = 3;
      local_1d8 = 1;
      local_1d0 = local_1b0;
      local_1c8 = 0xffffffffffffffff;
      local_1e0 = &local_1c0;
      local_1c0 = local_1e3;
      iVar3 = nn_recvmsg(line,&local_1e0,0);
      if (iVar3 != 3) goto LAB_00101a73;
      plVar4 = (long *)nn_cmsg_nxthdr_(&local_1e0,0);
      if (plVar4 != (long *)0x0) {
        do {
          if (((int)plVar4[1] == 1) && (*(int *)((long)plVar4 + 0xc) == 1)) goto LAB_001019ff;
          plVar4 = (long *)nn_cmsg_nxthdr_(&local_1e0,plVar4);
        } while (plVar4 != (long *)0x0);
      }
      main_cold_10();
      plVar4 = extraout_RAX_00;
LAB_001019ff:
      if (*plVar4 != 0x20) goto LAB_00101a78;
      if ((char)plVar4[3] < '\0') goto LAB_00101a7d;
      if (-1 < *(char *)((long)plVar4 + 0x1c)) goto LAB_00101a82;
      iVar3 = nn_sendmsg(line,&local_1e0,0);
      if (iVar3 == 3) {
        test_recv_impl((char *)0x6d,iVar2,sock_02,pcVar5);
        test_close_impl((char *)0x6f,iVar2,sock_03);
        test_close_impl((char *)0x70,line,sock_04);
        return 0;
      }
    }
    else {
      main_cold_1();
LAB_00101a5f:
      main_cold_2();
LAB_00101a64:
      main_cold_3();
LAB_00101a69:
      main_cold_11();
LAB_00101a6e:
      main_cold_4();
LAB_00101a73:
      main_cold_5();
LAB_00101a78:
      main_cold_6();
LAB_00101a7d:
      main_cold_7();
LAB_00101a82:
      main_cold_9();
    }
    main_cold_8();
  }
  main_cold_14();
LAB_00101a96:
  main_cold_13();
}

Assistant:

int main (int argc, const char *argv[])
{
    int rc;
    int rep;
    int req;
    struct nn_msghdr hdr;
    struct nn_iovec iovec;
    unsigned char body [3];
    unsigned char ctrl [256];
    struct nn_cmsghdr *cmsg;
    unsigned char *data;
    void *buf;
    char socket_address[128];

    test_addr_from(socket_address, "tcp", "127.0.0.1",
            get_test_port(argc, argv));
    
    rep = test_socket (AF_SP_RAW, NN_REP);
    test_bind (rep, socket_address);
    req = test_socket (AF_SP, NN_REQ);
    test_connect (req, socket_address);

    /* Test ancillary data in static buffer. */

    test_send (req, "ABC");

    iovec.iov_base = body;
    iovec.iov_len = sizeof (body);
    hdr.msg_iov = &iovec;
    hdr.msg_iovlen = 1;
    hdr.msg_control = ctrl;
    hdr.msg_controllen = sizeof (ctrl);
    rc = nn_recvmsg (rep, &hdr, 0);
    errno_assert (rc == 3);

    cmsg = NN_CMSG_FIRSTHDR (&hdr);
    while (1) {
        nn_assert (cmsg);
        if (cmsg->cmsg_level == PROTO_SP && cmsg->cmsg_type == SP_HDR)
            break;
        cmsg = NN_CMSG_NXTHDR (&hdr, cmsg);
    }
    nn_assert (cmsg->cmsg_len == NN_CMSG_SPACE (8+sizeof (size_t)));
    data = NN_CMSG_DATA (cmsg);
    nn_assert (!(data[0+sizeof (size_t)] & 0x80));
    nn_assert (data[4+sizeof (size_t)] & 0x80);

    rc = nn_sendmsg (rep, &hdr, 0);
    nn_assert (rc == 3);
    test_recv (req, "ABC");

    /* Test ancillary data in dynamically allocated buffer (NN_MSG). */

    test_send (req, "ABC");

    iovec.iov_base = body;
    iovec.iov_len = sizeof (body);
    hdr.msg_iov = &iovec;
    hdr.msg_iovlen = 1;
    hdr.msg_control = &buf;
    hdr.msg_controllen = NN_MSG;
    rc = nn_recvmsg (rep, &hdr, 0);
    errno_assert (rc == 3);

    cmsg = NN_CMSG_FIRSTHDR (&hdr);
    while (1) {
        nn_assert (cmsg);
        if (cmsg->cmsg_level == PROTO_SP && cmsg->cmsg_type == SP_HDR)
            break;
        cmsg = NN_CMSG_NXTHDR (&hdr, cmsg);
    }
    nn_assert (cmsg->cmsg_len == NN_CMSG_SPACE (8+sizeof (size_t)));
    data = NN_CMSG_DATA (cmsg);
    nn_assert (!(data[0+sizeof (size_t)] & 0x80));
    nn_assert (data[4+sizeof (size_t)] & 0x80);

    rc = nn_sendmsg (rep, &hdr, 0);
    nn_assert (rc == 3);
    test_recv (req, "ABC");

    test_close (req);
    test_close (rep);

    return 0;
}